

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet,int iCursor)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)(uint)pMaskSet->n;
  if (pMaskSet->n < 1) {
    uVar3 = 0;
  }
  lVar4 = -1;
  do {
    if (lVar4 - uVar3 == -1) {
      return 0;
    }
    lVar1 = lVar4 + 1;
    lVar2 = lVar4 + 1;
    lVar4 = lVar1;
  } while (pMaskSet->ix[lVar2] != iCursor);
  return 1L << ((byte)lVar1 & 0x3f);
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet, int iCursor){
  int i;
  assert( pMaskSet->n<=(int)sizeof(Bitmask)*8 );
  for(i=0; i<pMaskSet->n; i++){
    if( pMaskSet->ix[i]==iCursor ){
      return MASKBIT(i);
    }
  }
  return 0;
}